

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

char * __thiscall
fmt::v6::
format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>_>,_char,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
::on_format_specs(format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>_>,_char,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
                  *this,char *begin,char *end)

{
  bool bVar1;
  iterator it;
  char *in_RDX;
  specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
  *in_RDI;
  specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>_>
  handler;
  basic_format_specs<char> specs;
  custom_formatter<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
  f;
  basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>
  *in_stack_ffffffffffffff38;
  basic_format_parse_context<char,_fmt::v6::internal::error_handler> *in_stack_ffffffffffffff40;
  basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char> *this_00;
  specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>_>
  *in_stack_ffffffffffffff50;
  format_specs *in_stack_ffffffffffffff58;
  basic_format_parse_context<char,_fmt::v6::internal::error_handler> *in_stack_ffffffffffffff60;
  context_type *in_stack_ffffffffffffff68;
  arg_formatter<fmt::v6::buffer_range<char>_> *in_stack_ffffffffffffff70;
  basic_format_arg<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
  *in_stack_ffffffffffffffb0;
  arg_formatter<fmt::v6::buffer_range<char>_> *in_stack_ffffffffffffffb8;
  custom_formatter<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
  local_30;
  char *local_20;
  char *local_18;
  iterator local_8;
  
  local_20 = in_RDX;
  advance_to<char,fmt::v6::internal::error_handler>
            ((basic_format_parse_context<char,_fmt::v6::internal::error_handler> *)
             in_stack_ffffffffffffff50,(char *)in_RDI);
  internal::
  custom_formatter<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
  ::custom_formatter(&local_30,
                     (basic_format_parse_context<char,_fmt::v6::internal::error_handler> *)
                     &in_RDI->parse_context_,
                     (basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>
                      *)&in_RDI[1].parse_context_);
  bVar1 = visit_format_arg<fmt::v6::internal::custom_formatter<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>&,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>
                    ((custom_formatter<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
                      *)in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  if (bVar1) {
    local_8 = basic_format_parse_context<char,_fmt::v6::internal::error_handler>::begin
                        (in_stack_ffffffffffffff40);
  }
  else {
    basic_format_specs<char>::basic_format_specs
              ((basic_format_specs<char> *)in_stack_ffffffffffffff40);
    internal::
    specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
    ::specs_handler(&in_stack_ffffffffffffff50->
                     super_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
                    ,(basic_format_specs<char> *)in_RDI,in_stack_ffffffffffffff40,
                    in_stack_ffffffffffffff38);
    basic_format_arg<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
    ::type((basic_format_arg<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
            *)&in_RDI[3].parse_context_);
    internal::
    specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>_>
    ::specs_checker(in_stack_ffffffffffffff50,in_RDI,
                    (type)((ulong)in_stack_ffffffffffffff40 >> 0x20));
    local_18 = internal::
               parse_format_specs<char,fmt::v6::internal::specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<char,fmt::v6::internal::error_handler>,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>>&>
                         ((char *)in_RDI,(char *)in_stack_ffffffffffffff40,
                          (specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>_>
                           *)in_stack_ffffffffffffff38);
    if ((local_18 == local_20) || (*local_18 != '}')) {
      internal::error_handler::on_error((error_handler *)in_stack_ffffffffffffff50,(char *)in_RDI);
    }
    advance_to<char,fmt::v6::internal::error_handler>
              ((basic_format_parse_context<char,_fmt::v6::internal::error_handler> *)
               in_stack_ffffffffffffff50,(char *)in_RDI);
    this_00 = (basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>
               *)&in_RDI[1].parse_context_;
    arg_formatter<fmt::v6::buffer_range<char>_>::arg_formatter
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
               in_stack_ffffffffffffff58);
    it = visit_format_arg<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>>,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>
                   (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>::
    advance_to(this_00,(iterator)it.container);
    local_8 = local_18;
  }
  return local_8;
}

Assistant:

const Char* on_format_specs(const Char* begin, const Char* end) {
    advance_to(parse_context, begin);
    internal::custom_formatter<Context> f(parse_context, context);
    if (visit_format_arg(f, arg)) return parse_context.begin();
    basic_format_specs<Char> specs;
    using internal::specs_handler;
    using parse_context_t = basic_format_parse_context<Char>;
    internal::specs_checker<specs_handler<parse_context_t, Context>> handler(
        specs_handler<parse_context_t, Context>(specs, parse_context, context),
        arg.type());
    begin = parse_format_specs(begin, end, handler);
    if (begin == end || *begin != '}') on_error("missing '}' in format string");
    advance_to(parse_context, begin);
    context.advance_to(
        visit_format_arg(ArgFormatter(context, &parse_context, &specs), arg));
    return begin;
  }